

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void vkt::image::anon_unknown_0::replaceSnormReinterpretValues(PixelBufferAccess *access)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int local_40;
  deInt32 oldColor;
  int i;
  IVec4 newColor;
  IVec4 color;
  int x;
  int y;
  int z;
  PixelBufferAccess *access_local;
  
  for (x = 0; iVar2 = tcu::ConstPixelBufferAccess::getDepth(&access->super_ConstPixelBufferAccess),
      x < iVar2; x = x + 1) {
    for (color.m_data[3] = 0;
        iVar2 = tcu::ConstPixelBufferAccess::getHeight(&access->super_ConstPixelBufferAccess),
        color.m_data[3] < iVar2; color.m_data[3] = color.m_data[3] + 1) {
      for (color.m_data[2] = 0;
          iVar2 = tcu::ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess),
          color.m_data[2] < iVar2; color.m_data[2] = color.m_data[2] + 1) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)(newColor.m_data + 2),(int)access,color.m_data[2],
                   color.m_data[3]);
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)&oldColor,(Vector<int,_4> *)(newColor.m_data + 2));
        for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
          piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(newColor.m_data + 2),local_40)
          ;
          if (*piVar3 == -0x80) {
            piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&oldColor,local_40);
            *piVar3 = -0x7f;
          }
        }
        bVar1 = tcu::Vector<int,_4>::operator!=
                          ((Vector<int,_4> *)&oldColor,(Vector<int,_4> *)(newColor.m_data + 2));
        if (bVar1) {
          tcu::PixelBufferAccess::setPixel
                    (access,(IVec4 *)&oldColor,color.m_data[2],color.m_data[3],x);
        }
      }
    }
  }
  return;
}

Assistant:

void replaceSnormReinterpretValues (const tcu::PixelBufferAccess access)
{
	DE_ASSERT(tcu::getTextureChannelClass(access.getFormat().type) == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT);

	for (int z = 0; z < access.getDepth(); ++z)
	for (int y = 0; y < access.getHeight(); ++y)
	for (int x = 0; x < access.getWidth(); ++x)
	{
		const tcu::IVec4 color(access.getPixelInt(x, y, z));
		tcu::IVec4 newColor = color;

		for (int i = 0; i < 4; ++i)
		{
			const deInt32 oldColor(color[i]);
			if (oldColor == -128) newColor[i] = -127;
		}

		if (newColor != color)
		access.setPixel(newColor, x, y, z);
	}
}